

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_wav_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                     void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                     ma_allocation_callbacks *pAllocationCallbacks,ma_wav *pWav)

{
  ma_format mVar1;
  ma_bool32 mVar2;
  ma_data_source_base *pDataSourceBase;
  ma_result mVar3;
  
  mVar3 = MA_INVALID_ARGS;
  if (pWav != (ma_wav *)0x0) {
    memset(pWav,0,0x200);
    if (((pConfig != (ma_decoding_backend_config *)0x0) &&
        (mVar1 = pConfig->preferredFormat, mVar1 < ma_format_count)) &&
       ((0x34U >> (mVar1 & 0x1f) & 1) != 0)) {
      pWav->format = mVar1;
    }
    (pWav->ds).rangeBegInFrames = 0;
    (pWav->ds).rangeEndInFrames = 0;
    (pWav->ds).loopBegInFrames = 0;
    (pWav->ds).loopEndInFrames = 0;
    (pWav->ds).pCurrent = (ma_data_source *)0x0;
    (pWav->ds).pNext = (ma_data_source *)0x0;
    (pWav->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    *(undefined8 *)&(pWav->ds).isLooping = 0;
    (pWav->ds).vtable = &g_ma_wav_ds_vtable;
    (pWav->ds).rangeEndInFrames = 0xffffffffffffffff;
    (pWav->ds).loopEndInFrames = 0xffffffffffffffff;
    (pWav->ds).pCurrent = pWav;
    (pWav->ds).pNext = (ma_data_source *)0x0;
    (pWav->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    if (onSeek != (ma_seek_proc)0x0 && onRead != (ma_read_proc)0x0) {
      pWav->onRead = onRead;
      pWav->onSeek = onSeek;
      pWav->onTell = onTell;
      pWav->pReadSeekTellUserData = pReadSeekTellUserData;
      mVar2 = ma_dr_wav_init(&pWav->dr,ma_wav_dr_callback__read,ma_wav_dr_callback__seek,pWav,
                             pAllocationCallbacks);
      if (mVar2 == 0) {
        mVar3 = MA_INVALID_FILE;
      }
      else {
        ma_wav_post_init(pWav);
        mVar3 = MA_SUCCESS;
      }
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_wav_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_wav* pWav)
{
    ma_result result;

    result = ma_wav_init_internal(pConfig, pWav);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->onTell = onTell;
    pWav->pReadSeekTellUserData = pReadSeekTellUserData;

    #if !defined(MA_NO_WAV)
    {
        ma_bool32 wavResult;

        wavResult = ma_dr_wav_init(&pWav->dr, ma_wav_dr_callback__read, ma_wav_dr_callback__seek, pWav, pAllocationCallbacks);
        if (wavResult != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_wav_post_init(pWav);

        return MA_SUCCESS;
    }
    #else
    {
        /* wav is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}